

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
* __thiscall
Kandinsky::Expression::derivatives
          (map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
           *__return_storage_ptr__,Expression *this)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Base_ptr p_Var3;
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  variableSet;
  _Rb_tree<Kandinsky::Variable,_Kandinsky::Variable,_std::_Identity<Kandinsky::Variable>,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  _Stack_a8;
  Expression local_78;
  pair<Kandinsky::Variable,_Kandinsky::Expression> local_60;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (**this->_vptr_Expression)(&_Stack_a8);
  for (p_Var3 = _Stack_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &_Stack_a8._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    peVar2 = (this->m_baseExpressionPtr).
             super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_BaseExpression[2])(&local_78,peVar2,p_Var3 + 1);
    std::pair<Kandinsky::Variable,_Kandinsky::Expression>::pair<Kandinsky::Expression,_true>
              (&local_60,(Variable *)(p_Var3 + 1),&local_78);
    std::
    _Rb_tree<Kandinsky::Variable,std::pair<Kandinsky::Variable_const,Kandinsky::Expression>,std::_Select1st<std::pair<Kandinsky::Variable_const,Kandinsky::Expression>>,Kandinsky::VariableLessThanComparator,std::allocator<std::pair<Kandinsky::Variable_const,Kandinsky::Expression>>>
    ::_M_emplace_unique<std::pair<Kandinsky::Variable,Kandinsky::Expression>>
              ((_Rb_tree<Kandinsky::Variable,std::pair<Kandinsky::Variable_const,Kandinsky::Expression>,std::_Select1st<std::pair<Kandinsky::Variable_const,Kandinsky::Expression>>,Kandinsky::VariableLessThanComparator,std::allocator<std::pair<Kandinsky::Variable_const,Kandinsky::Expression>>>
                *)__return_storage_ptr__,&local_60);
    std::pair<Kandinsky::Variable,_Kandinsky::Expression>::~pair(&local_60);
    ~Expression(&local_78);
  }
  std::
  _Rb_tree<Kandinsky::Variable,_Kandinsky::Variable,_std::_Identity<Kandinsky::Variable>,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  ::~_Rb_tree(&_Stack_a8);
  return __return_storage_ptr__;
}

Assistant:

std::map<Variable, Expression, VariableLessThanComparator> Expression::derivatives() const
    {
        std::map<Variable, Expression, VariableLessThanComparator> derivativeMap;
        std::set<Variable, VariableLessThanComparator> variableSet = variables();
        for (auto& variable : variableSet)
        {
            derivativeMap.insert(std::make_pair(variable, differentiate(variable)));
        }
        return derivativeMap;
    }